

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall Timer::stop(Timer *this)

{
  SharedPtr loop;
  EventLoop *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  if (this->timerId != 0) {
    EventLoop::eventLoop();
    if (local_20 != (EventLoop *)0x0) {
      EventLoop::unregisterTimer(local_20,this->timerId);
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    this->timerId = 0;
  }
  return;
}

Assistant:

void Timer::stop()
{
    if (timerId) {
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->unregisterTimer(timerId);
        }
        timerId = 0;
    }
}